

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall Js::FunctionBody::CreateCacheIdToPropertyIdMap(FunctionBody *this)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  Recycler *this_00;
  int *piVar5;
  uint i;
  ulong uVar6;
  ulong count;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  if ((this->cacheIdToPropertyIdMap).ptr != (int *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1090,"(this->cacheIdToPropertyIdMap == nullptr)",
                                "this->cacheIdToPropertyIdMap == nullptr");
    if (!bVar2) goto LAB_006cf692;
    *puVar4 = 0;
  }
  if ((this->inlineCaches).ptr != (void **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1091,"(this->inlineCaches == nullptr)",
                                "this->inlineCaches == nullptr");
    if (!bVar2) {
LAB_006cf692:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  uVar3 = GetInlineCacheCount(this);
  if (uVar3 != 0) {
    count = (ulong)uVar3;
    local_50 = (undefined1  [8])&int::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_29f156b;
    data.filename._0_4_ = 0x1096;
    data.plusSize = count;
    this_00 = Memory::Recycler::TrackAllocInfo
                        (((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                         recycler,(TrackAllocData *)local_50);
    piVar5 = Memory::AllocateArray<Memory::Recycler,int,false>
                       ((Memory *)this_00,(Recycler *)Memory::Recycler::AllocLeaf,0,count);
    Memory::WriteBarrierPtr<int>::WriteBarrierSet(&this->cacheIdToPropertyIdMap,piVar5);
    piVar5 = (this->cacheIdToPropertyIdMap).ptr;
    for (uVar6 = 0; count != uVar6; uVar6 = uVar6 + 1) {
      piVar5[uVar6] = -1;
    }
  }
  return;
}

Assistant:

void FunctionBody::CreateCacheIdToPropertyIdMap()
    {
        Assert(this->cacheIdToPropertyIdMap == nullptr);
        Assert(this->inlineCaches == nullptr);
        uint count = this->GetInlineCacheCount() ;
        if (count!= 0)
        {
            this->cacheIdToPropertyIdMap =
                RecyclerNewArrayLeaf(this->m_scriptContext->GetRecycler(), PropertyId, count);
#if DBG
            for (uint i = 0; i < count; i++)
            {
                this->cacheIdToPropertyIdMap[i] = Js::Constants::NoProperty;
            }
#endif
        }

    }